

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O0

void sd_offset_update<dense_parameters>
               (dense_parameters *weights,features *fs,uint64_t offset,float update,
               float regularization)

{
  float fVar1;
  float fVar2;
  size_t sVar3;
  float *pfVar4;
  unsigned_long *puVar5;
  weight *pwVar6;
  long in_RDX;
  v_array<float> *in_RSI;
  dense_parameters *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  size_t i;
  ulong local_28;
  
  local_28 = 0;
  while( true ) {
    sVar3 = features::size((features *)0x23b3fc);
    if (sVar3 <= local_28) break;
    pfVar4 = v_array<float>::operator[](in_RSI,local_28);
    fVar1 = *pfVar4;
    puVar5 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RSI + 1),local_28);
    pwVar6 = dense_parameters::operator[](in_RDI,*puVar5);
    fVar2 = pwVar6[in_RDX];
    puVar5 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RSI + 1),local_28);
    pwVar6 = dense_parameters::operator[](in_RDI,*puVar5);
    pwVar6[in_RDX] = in_XMM0_Da * fVar1 + -(in_XMM1_Da * fVar2) + pwVar6[in_RDX];
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void sd_offset_update(T& weights, features& fs, uint64_t offset, float update, float regularization)
{
  for (size_t i = 0; i < fs.size(); i++)
    (&weights[fs.indicies[i]])[offset] += update * fs.values[i] - regularization * (&weights[fs.indicies[i]])[offset];
}